

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_4>_>::doEvaluate
          (IVal *__return_storage_ptr__,Variable<tcu::Vector<int,_4>_> *this,EvalContext *ctx)

{
  undefined7 uVar1;
  IVal *pIVar2;
  long lVar3;
  IVal *pIVar4;
  byte bVar5;
  
  bVar5 = 0;
  pIVar2 = Environment::lookup<tcu::Vector<int,4>>(ctx->env,this);
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar3 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x70);
  pIVar4 = __return_storage_ptr__;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined7 *)&pIVar2->m_data[0].field_0x1;
    pIVar4->m_data[0].m_hasNaN = pIVar2->m_data[0].m_hasNaN;
    *(undefined7 *)&pIVar4->m_data[0].field_0x1 = uVar1;
    pIVar2 = (IVal *)((long)pIVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    pIVar4 = (IVal *)((long)pIVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

IVal			doEvaluate	(const EvalContext& ctx)		const
	{
		return ctx.env.lookup<T>(*this);
	}